

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_gas_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RCX;
  CHAR_DATA *in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined4 in_R8D;
  undefined4 unaff_retaddr;
  int dam;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  int in_stack_00000084;
  int in_stack_00000088;
  int in_stack_0000008c;
  void *in_stack_00000090;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  CHAR_DATA *bch;
  undefined4 in_stack_ffffffffffffffe0;
  
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
      in_stack_ffffffffffffffd0,
      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
      in_stack_ffffffffffffffd0,
      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  iVar2 = dice((int)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  poison_effect(in_stack_00000090,in_stack_0000008c,in_stack_00000088,in_stack_00000084);
  ch_00 = in_RDX->in_room->people;
  while (bch = ch_00, bch != (CHAR_DATA *)0x0) {
    ch_00 = bch->next_in_room;
    bVar1 = is_safe(ch_00,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    if ((((!bVar1) || (bch->fighting == (CHAR_DATA *)0x0)) || (bch->fighting == in_RDX)) &&
       (bVar1 = is_same_group(in_RDX,bch), !bVar1)) {
      bVar1 = saves_spell((int)vch,vch_next,dam);
      if (bVar1) {
        poison_effect(in_stack_00000090,in_stack_0000008c,in_stack_00000088,in_stack_00000084);
        damage_old((CHAR_DATA *)CONCAT44(dam,unaff_retaddr),(CHAR_DATA *)CONCAT44(in_EDI,in_ESI),
                   (int)((ulong)in_RDX >> 0x20),(int)in_RDX,(int)((ulong)in_RCX >> 0x20),
                   SUB81((ulong)in_RCX >> 0x18,0));
      }
      else {
        poison_effect(in_stack_00000090,in_stack_0000008c,in_stack_00000088,in_stack_00000084);
        damage_old((CHAR_DATA *)CONCAT44(dam,unaff_retaddr),(CHAR_DATA *)CONCAT44(in_EDI,in_ESI),
                   (int)((ulong)in_RDX >> 0x20),(int)in_RDX,(int)((ulong)in_RCX >> 0x20),
                   SUB81((ulong)in_RCX >> 0x18,0));
      }
    }
  }
  return;
}

Assistant:

void spell_gas_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	int dam;

	act("$n breathes out a cloud of poisonous gas!", ch, nullptr, nullptr, TO_ROOM);
	act("You breath out a cloud of poisonous gas.", ch, nullptr, nullptr, TO_CHAR);

	dam = dice(level, 5);

	poison_effect(ch->in_room, level, dam, TARGET_ROOM);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_safe(ch, vch) && vch->fighting != nullptr && vch->fighting != ch)
			continue;

		if (is_same_group(ch, vch))
			continue;

		if (saves_spell(level, vch, DAM_POISON))
		{
			poison_effect(vch, level / 2, dam / 4, TARGET_CHAR);
			damage_old(ch, vch, dam / 2, sn, DAM_POISON, true);
		}
		else
		{
			poison_effect(vch, level, dam, TARGET_CHAR);
			damage_old(ch, vch, dam, sn, DAM_POISON, true);
		}
	}
}